

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::onlyEmptyStatements(Analyzer *this,int from,Node *node)

{
  size_type sVar1;
  reference ppNVar2;
  long in_RDX;
  int in_ESI;
  size_t i;
  ulong local_28;
  
  local_28 = (ulong)in_ESI;
  while( true ) {
    sVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                      ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18));
    if (sVar1 <= local_28) {
      return true;
    }
    ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),local_28);
    if ((*ppNVar2 != (value_type)0x0) &&
       (ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),local_28),
       (*ppNVar2)->nodeType != PNT_EMPTY_STATEMENT)) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool onlyEmptyStatements(int from, Node * node)
  {
    for (size_t i = from; i < node->children.size(); i++)
      if (node->children[i] && node->children[i]->nodeType != PNT_EMPTY_STATEMENT)
        return false;
    return true;
  }